

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O3

void __thiscall
helics::MessageTimer::updateTimer
          (MessageTimer *this,int32_t timerIndex,time_type expirationTime,ActionMessage *mess)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  epoll_reactor *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
  *op;
  pthread_mutex_t *__mutex;
  undefined8 uVar6;
  implementation_type *impl;
  long *in_FS_OFFSET;
  type timerCallback;
  type local_98;
  pthread_mutex_t *local_78;
  ptr local_70;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  int32_t local_48;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
  *local_40;
  ActionMessage *local_38;
  
  __mutex = (pthread_mutex_t *)&this->timerLock;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 == 0) {
    if ((-1 < timerIndex) &&
       (psVar1 = (this->timers).
                 super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       timerIndex <
       (int)((ulong)((long)(this->timers).
                           super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4))) {
      peVar2 = psVar1[(uint)timerIndex].
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_70.h = (type *)((ulong)local_70.h & 0xffffffff00000000);
      local_78 = __mutex;
      local_38 = mess;
      local_70.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
                    *)std::_V2::system_category();
      impl = (implementation_type *)((long)&peVar2->impl_ + 8);
      local_40 = local_70.v;
      asio::detail::
      deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
      ::cancel((peVar2->impl_).service_,impl,(error_code *)&local_70);
      (impl->expiry).__d.__r = (rep)expirationTime.__d.__r;
      (this->expirationTimes).
      super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].__d.__r =
           (rep)expirationTime.__d.__r;
      ActionMessage::operator=
                ((this->buffers).
                 super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                 _M_impl.super__Vector_impl_data._M_start + (uint)timerIndex,local_38);
      std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<helics::MessageTimer,void>
                ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (__weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)this);
      peVar2 = (this->timers).
               super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].
               super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_58;
      local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_50;
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
      lVar3 = *(long *)&peVar2->impl_;
      if (*(long *)(*in_FS_OFFSET + -0x13d8) == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x13d8) + 8);
      }
      local_98.timerIndex = timerIndex;
      local_70.h = &local_98;
      local_48 = timerIndex;
      op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
            *)asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar6,0x80,8);
      _Var4._M_pi = local_98.ptr.
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
      (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
      (op->super_wait_op).super_operation.func_ =
           asio::detail::
           wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_asio::any_io_executor>
           ::do_complete;
      (op->super_wait_op).super_operation.task_result_ = 0;
      (op->super_wait_op).ec_._M_value = 0;
      (op->super_wait_op).ec_._M_cat = (error_category *)local_40;
      (op->super_wait_op).cancellation_key_ = (void *)0x0;
      local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      (op->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (op->handler_).timerIndex = local_98.timerIndex;
      local_70.v = op;
      asio::detail::
      handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
      handler_work_base(&(op->work_).
                         super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                        ,0,0,(executor_type *)((long)&peVar2->impl_ + 0x40));
      this_00 = *(epoll_reactor **)(lVar3 + 0x58);
      *(bool *)((long)&peVar2->impl_ + 0x10) = true;
      local_70.p = op;
      asio::detail::epoll_reactor::
      schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                (this_00,(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                          *)(lVar3 + 0x28),(time_type *)((long)&peVar2->impl_ + 8),
                 (per_timer_data *)((long)&peVar2->impl_ + 0x18),(wait_op *)op);
      local_70.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
                    *)0x0;
      local_70.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
                    *)0x0;
      asio::detail::
      wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_asio::any_io_executor>
      ::ptr::reset(&local_70);
      __mutex = local_78;
      if (local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void MessageTimer::updateTimer(int32_t timerIndex, time_type expirationTime, ActionMessage mess)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        timers[timerIndex]->expires_at(expirationTime);
        expirationTimes[timerIndex] = expirationTime;
        buffers[timerIndex] = std::move(mess);

        auto timerCallback = [ptr = shared_from_this(), timerIndex](const std::error_code& ec) {
            processTimerCallback(ptr, timerIndex, ec);
        };

        timers[timerIndex]->async_wait(timerCallback);
    }
}